

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::filterTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
                  TestSpec *testSpec,IConfig *config)

{
  bool bVar1;
  reference this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_RSI;
  value_type *in_RDI;
  TestCase *testCase;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *filtered;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff88;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  value_type *testCase_00;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  in_stack_ffffffffffffffb8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffc0;
  
  testCase_00 = in_RDI;
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x1387df);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::size(in_RSI);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
            (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8._M_current);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
            (in_stack_ffffffffffffff88);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            (in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff97,
                                        CONCAT16(in_stack_ffffffffffffff96,
                                                 CONCAT15(in_stack_ffffffffffffff95,
                                                          in_stack_ffffffffffffff90))),
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
           ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)&stack0xffffffffffffffb8);
    in_stack_ffffffffffffff97 = TestSpec::hasFilters((TestSpec *)0x138851);
    if (((!(bool)in_stack_ffffffffffffff97) &&
        (bVar1 = TestCaseInfo::isHidden(&this->super_TestCaseInfo), !bVar1)) ||
       ((in_stack_ffffffffffffff96 = TestSpec::hasFilters((TestSpec *)0x13887b),
        (bool)in_stack_ffffffffffffff96 &&
        (in_stack_ffffffffffffff95 =
              matchTest(testCase_00,(TestSpec *)in_RDI,
                        (IConfig *)
                        CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,
                                          CONCAT15(in_stack_ffffffffffffff95,
                                                   in_stack_ffffffffffffff90)))),
        (bool)in_stack_ffffffffffffff95)))) {
      clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)testCase_00,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  *)&stack0xffffffffffffffb8);
  }
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI;
}

Assistant:

std::vector<TestCase> filterTests( std::vector<TestCase> const& testCases, TestSpec const& testSpec, IConfig const& config ) {
        std::vector<TestCase> filtered;
        filtered.reserve( testCases.size() );
        for (auto const& testCase : testCases) {
            if ((!testSpec.hasFilters() && !testCase.isHidden()) ||
                (testSpec.hasFilters() && matchTest(testCase, testSpec, config))) {
                filtered.push_back(testCase);
            }
        }
        return filtered;
    }